

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metatype_generic.cpp
# Opt level: O0

generic * mpt::metatype::generic::create(type_t type,void *ptr,type_traits *traits)

{
  int iVar1;
  int *piVar2;
  generic *__s;
  void *val;
  void *data;
  generic *mt;
  type_traits *traits_local;
  void *ptr_local;
  type_t type_local;
  
  if (traits->size == 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    type_local = 0;
  }
  else {
    type_local = (type_t)malloc(traits->size + 0x28);
    if ((generic *)type_local == (generic *)0x0) {
      type_local = 0;
    }
    else {
      __s = (generic *)(type_local + 0x28);
      if (traits->init == (_func_int_void_ptr_void_ptr *)0x0) {
        if (ptr == (void *)0x0) {
          memset(__s,0,traits->size);
        }
        else {
          memcpy(__s,ptr,traits->size);
        }
      }
      else {
        iVar1 = (*traits->init)(__s,ptr);
        if (iVar1 < 0) {
          free((void *)type_local);
          return (generic *)0x0;
        }
      }
      generic((generic *)type_local);
      ((generic *)type_local)->_traits = traits;
      ((generic *)type_local)->_val = __s;
      ((generic *)type_local)->_type = type;
    }
  }
  return (generic *)type_local;
}

Assistant:

metatype::generic *metatype::generic::create(type_t type, const void *ptr, const type_traits &traits)
{
	if (!traits.size) {
		errno = EINVAL;
		return 0;
	}
	metatype::generic *mt;
	void *data = malloc(sizeof(*mt) + traits.size);
	if (!data) {
		return 0;
	}
	void *val = static_cast<metatype::generic *>(data) + 1;
	if (!traits.init) {
		if (ptr) {
			memcpy(val, ptr, traits.size);
		}
		else {
			memset(val, 0, traits.size);
		}
	}
	else if (traits.init(val, ptr) < 0) {
		free(data);
		return 0;
	}
	
	mt = new (data) metatype::generic();
	mt->_traits = &traits;
	mt->_val = val;
	mt->_type = type;
	
	return mt;
}